

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position_first_step2.cpp
# Opt level: O0

bool __thiscall
ruckig::PositionFirstOrderStep2::get_profile(PositionFirstOrderStep2 *this,Profile *profile)

{
  double dVar1;
  double dVar2;
  value_type vVar3;
  bool bVar4;
  reference pvVar5;
  double vf;
  Profile *profile_local;
  PositionFirstOrderStep2 *this_local;
  
  dVar1 = this->pd;
  dVar2 = this->tf;
  pvVar5 = std::array<double,_7UL>::operator[](&profile->t,0);
  *pvVar5 = 0.0;
  pvVar5 = std::array<double,_7UL>::operator[](&profile->t,1);
  *pvVar5 = 0.0;
  pvVar5 = std::array<double,_7UL>::operator[](&profile->t,2);
  *pvVar5 = 0.0;
  vVar3 = this->tf;
  pvVar5 = std::array<double,_7UL>::operator[](&profile->t,3);
  *pvVar5 = vVar3;
  pvVar5 = std::array<double,_7UL>::operator[](&profile->t,4);
  *pvVar5 = 0.0;
  pvVar5 = std::array<double,_7UL>::operator[](&profile->t,5);
  *pvVar5 = 0.0;
  pvVar5 = std::array<double,_7UL>::operator[](&profile->t,6);
  *pvVar5 = 0.0;
  bVar4 = Profile::
          check_for_first_order_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                    (profile,this->tf,dVar1 / dVar2,this->_vMax,this->_vMin);
  return bVar4;
}

Assistant:

bool PositionFirstOrderStep2::get_profile(Profile& profile) {
    const double vf = pd / tf;

    profile.t[0] = 0;
    profile.t[1] = 0;
    profile.t[2] = 0;
    profile.t[3] = tf;
    profile.t[4] = 0;
    profile.t[5] = 0;
    profile.t[6] = 0;

    return profile.check_for_first_order_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(tf, vf, _vMax, _vMin);
}